

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O2

void __thiscall
kj::_::Debug::Fault::
Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::compiler::Declaration::Which,capnp::compiler::Declaration::Which>&>
          (Fault *this,char *file,int line,Type code,char *condition,char *macroArgs,
          DebugComparison<capnp::compiler::Declaration::Which,_capnp::compiler::Declaration::Which>
          *params)

{
  undefined4 in_register_00000014;
  String argValues [1];
  Array<char> local_48;
  
  this->exception = (Exception *)0x0;
  str<kj::_::DebugComparison<capnp::compiler::Declaration::Which,capnp::compiler::Declaration::Which>&>
            ((String *)&local_48,(kj *)params,
             (DebugComparison<capnp::compiler::Declaration::Which,_capnp::compiler::Declaration::Which>
              *)CONCAT44(in_register_00000014,line));
  init(this,(EVP_PKEY_CTX *)file);
  Array<char>::~Array(&local_48);
  return;
}

Assistant:

Debug::Fault::Fault(const char* file, int line, Code code,
                    const char* condition, const char* macroArgs, Params&&... params)
    : exception(nullptr) {
  String argValues[sizeof...(Params)] = {str(params)...};
  init(file, line, code, condition, macroArgs,
       arrayPtr(argValues, sizeof...(Params)));
}